

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.h
# Opt level: O3

void __thiscall bsplib::Rdma::ActionBuf::push_back(ActionBuf *this,Action *action)

{
  pointer *ppAVar1;
  pointer puVar2;
  iterator __position;
  Memslot MVar3;
  size_t sVar4;
  int iVar5;
  undefined4 uVar6;
  Kind KVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  __position._M_current =
       (this->m_actions).
       super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_actions).
      super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<bsplib::Rdma::Action,std::allocator<bsplib::Rdma::Action>>::
    _M_realloc_insert<bsplib::Rdma::Action_const&>
              ((vector<bsplib::Rdma::Action,std::allocator<bsplib::Rdma::Action>> *)this,__position,
               action);
  }
  else {
    (__position._M_current)->size = action->size;
    KVar7 = action->kind;
    iVar8 = action->target_pid;
    iVar9 = action->src_pid;
    iVar10 = action->dst_pid;
    iVar5 = action->tag;
    uVar6 = *(undefined4 *)&action->field_0x14;
    MVar3 = action->src_slot;
    sVar4 = action->offset;
    (__position._M_current)->dst_slot = action->dst_slot;
    (__position._M_current)->offset = sVar4;
    (__position._M_current)->tag = iVar5;
    *(undefined4 *)&(__position._M_current)->field_0x14 = uVar6;
    (__position._M_current)->src_slot = MVar3;
    (__position._M_current)->kind = KVar7;
    (__position._M_current)->target_pid = iVar8;
    (__position._M_current)->src_pid = iVar9;
    (__position._M_current)->dst_pid = iVar10;
    ppAVar1 = &(this->m_actions).
               super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppAVar1 = *ppAVar1 + 1;
  }
  puVar2 = (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + action->target_pid;
  *puVar2 = *puVar2 + 1;
  return;
}

Assistant:

void push_back( const Action & action )
        {   
            m_actions.push_back( action );
            m_counts[ action.target_pid ] += 1;
        }